

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::NewDB(DBImpl *this)

{
  WritableFile *pWVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [8];
  long in_RSI;
  WritableFile *file;
  string manifest;
  string record;
  Writer log;
  VersionEdit new_db;
  WritableFile *local_160;
  string local_158;
  WritableFile *local_138;
  DB local_130;
  size_type sStack_128;
  undefined1 local_120 [8];
  string local_118;
  Writer local_f8;
  VersionEdit local_d8;
  
  local_d8.comparator_._M_dataplus._M_p = (pointer)&local_d8.comparator_.field_2;
  local_d8.comparator_._M_string_length = 0;
  local_d8.comparator_.field_2._M_local_buf[0] = '\0';
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.compact_pointers_.
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  VersionEdit::Clear(&local_d8);
  local_158._M_dataplus._M_p = (pointer)(**(code **)(**(long **)(in_RSI + 0x18) + 0x18))();
  local_158._M_string_length = strlen(local_158._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&local_d8,(Slice *)&local_158);
  local_d8.has_log_number_ = true;
  local_d8.log_number_ = 0;
  local_d8.has_next_file_number_ = true;
  local_d8.has_last_sequence_ = true;
  local_d8.next_file_number_ = 2;
  local_d8.last_sequence_ = 0;
  DescriptorFileName(&local_158,(string *)(in_RSI + 0x898),1);
  (**(code **)(**(long **)(in_RSI + 8) + 0x20))(this,*(long **)(in_RSI + 8),&local_158,&local_160);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    leveldb::log::Writer::Writer(&local_f8,local_160);
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    VersionEdit::EncodeTo(&local_d8,&local_118);
    local_130._vptr_DB = (_func_int **)local_118._M_dataplus._M_p;
    sStack_128 = local_118._M_string_length;
    leveldb::log::Writer::AddRecord((Writer *)local_120,(Slice *)&local_f8);
    pWVar1 = (WritableFile *)(this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_120;
    auVar3 = local_120;
    local_120 = (undefined1  [8])pWVar1;
    if (pWVar1 != (WritableFile *)0x0) {
      operator_delete__(pWVar1);
      auVar3 = (undefined1  [8])(this->super_DB)._vptr_DB;
    }
    if (auVar3 == (undefined1  [8])0x0) {
      (*local_160->_vptr_WritableFile[3])(&local_130);
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = local_130._vptr_DB;
      local_130._vptr_DB = (_func_int **)paVar2;
      if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete__(paVar2);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    leveldb::log::Writer::~Writer(&local_f8);
    if (local_160 != (WritableFile *)0x0) {
      (*local_160->_vptr_WritableFile[1])();
    }
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      SetCurrentFile((leveldb *)&local_f8,*(Env **)(in_RSI + 8),(string *)(in_RSI + 0x898),1);
      local_138 = (WritableFile *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_f8.dest_;
      local_f8.dest_ = local_138;
    }
    else {
      (**(code **)(**(long **)(in_RSI + 8) + 0x40))(&local_138,*(long **)(in_RSI + 8),&local_158);
    }
    if (local_138 != (WritableFile *)0x0) {
      operator_delete__(local_138);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  VersionEdit::~VersionEdit(&local_d8);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::NewDB() {
  VersionEdit new_db;
  new_db.SetComparatorName(user_comparator()->Name());
  new_db.SetLogNumber(0);
  new_db.SetNextFile(2);
  new_db.SetLastSequence(0);

  const std::string manifest = DescriptorFileName(dbname_, 1);
  WritableFile* file;
  Status s = env_->NewWritableFile(manifest, &file);
  if (!s.ok()) {
    return s;
  }
  {
    log::Writer log(file);
    std::string record;
    new_db.EncodeTo(&record);
    s = log.AddRecord(record);
    if (s.ok()) {
      s = file->Close();
    }
  }
  delete file;
  if (s.ok()) {
    // Make "CURRENT" file that points to the new manifest file.
    s = SetCurrentFile(env_, dbname_, 1);
  } else {
    env_->DeleteFile(manifest);
  }
  return s;
}